

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O3

void effect_simple(wchar_t index,source origin,char *dice_string,wchar_t subtype,wchar_t radius,
                  wchar_t other,wchar_t y,wchar_t x,_Bool *ident)

{
  wchar_t dir_00;
  dice_t *dice;
  effect *peVar1;
  _Bool *ident_00;
  source origin_00;
  _Bool dummy_ident;
  anon_enum_32 local_78;
  wchar_t dir;
  anon_union_8_5_62f3dbed_for_which local_70;
  effect effect;
  
  local_70 = origin.which;
  local_78 = origin.what;
  dir = L'\x05';
  dummy_ident = false;
  effect.next = (effect *)0x0;
  effect.dice = (dice_t *)0x0;
  effect.y = L'\0';
  effect.x = L'\0';
  effect.subtype = L'\0';
  effect.radius = L'\0';
  effect.other = L'\0';
  effect._44_4_ = 0;
  effect.msg = (char *)0x0;
  effect._10_6_ = 0;
  effect.index = (ushort)index;
  dice = dice_new();
  effect.dice = dice;
  dice_parse_string(dice,dice_string);
  effect.radius = radius;
  effect.subtype = subtype;
  effect.other = other;
  effect.x = x;
  effect.y = y;
  dir_00 = L'\x05';
  if ((ushort)((ushort)index - 1) < 0x7f) {
    peVar1 = &effect;
    do {
      if (effects[peVar1->index].aim != false) {
        get_aim_dir(&dir);
        dir_00 = dir;
        break;
      }
      peVar1 = peVar1->next;
    } while (peVar1 != (effect *)0x0);
  }
  ident_00 = &dummy_ident;
  if (ident != (_Bool *)0x0) {
    ident_00 = ident;
  }
  origin_00._4_4_ = 0;
  origin_00.what = local_78;
  origin_00.which.trap = local_70.trap;
  effect_do(&effect,origin_00,(object *)0x0,ident_00,true,dir_00,L'\0',L'\0',(command *)0x0);
  dice_free(dice);
  return;
}

Assistant:

void effect_simple(int index,
				   struct source origin,
				   const char *dice_string,
				   int subtype,
				   int radius,
				   int other,
				   int y,
				   int x,
				   bool *ident)
{
	struct effect effect;
	int dir = DIR_TARGET;
	bool dummy_ident = false;

	/* Set all the values */
	memset(&effect, 0, sizeof(effect));
	effect.index = index;
	effect.dice = dice_new();
	dice_parse_string(effect.dice, dice_string);
	effect.subtype = subtype;
	effect.radius = radius;
	effect.other = other;
	effect.y = y;
	effect.x = x;

	/* Direction if needed */
	if (effect_aim(&effect))
		get_aim_dir(&dir);

	/* Do the effect */
	if (!ident) {
		ident = &dummy_ident;
	}

	effect_do(&effect, origin, NULL, ident, true, dir, 0, 0, NULL);
	dice_free(effect.dice);
}